

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0>
       ::run(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *mat,scalar_sum_op<double> *func)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  Index index;
  long lVar4;
  long lVar5;
  long lVar6;
  Scalar SVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar1 = (mat->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (lVar1 != 0) {
    lVar5 = 4;
    lVar4 = lVar1 / 4;
    pdVar2 = (((mat->m_lhs).m_matrix)->
             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.m_data;
    pdVar3 = (mat->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    if (lVar1 + 1U < 3) {
      SVar7 = *pdVar2 * *pdVar3;
      for (lVar5 = 1; lVar5 < lVar1; lVar5 = lVar5 + 1) {
        SVar7 = SVar7 + pdVar2[lVar5] * pdVar3[lVar5];
      }
    }
    else {
      lVar6 = (lVar1 / 2) * 2;
      dVar10 = *pdVar2 * *pdVar3;
      dVar11 = pdVar2[1] * pdVar3[1];
      if (3 < lVar1) {
        dVar8 = pdVar2[2] * pdVar3[2];
        dVar9 = pdVar2[3] * pdVar3[3];
        for (; lVar5 < lVar4 * 4; lVar5 = lVar5 + 4) {
          dVar10 = dVar10 + pdVar2[lVar5] * pdVar3[lVar5];
          dVar11 = dVar11 + (pdVar2 + lVar5)[1] * (pdVar3 + lVar5)[1];
          dVar8 = dVar8 + pdVar2[lVar5 + 2] * pdVar3[lVar5 + 2];
          dVar9 = dVar9 + (pdVar2 + lVar5 + 2)[1] * (pdVar3 + lVar5 + 2)[1];
        }
        dVar10 = dVar10 + dVar8;
        dVar11 = dVar11 + dVar9;
        if (lVar4 * 4 < lVar6) {
          dVar10 = dVar10 + pdVar2[lVar4 * 4] * pdVar3[lVar4 * 4];
          dVar11 = dVar11 + (pdVar2 + lVar4 * 4)[1] * (pdVar3 + lVar4 * 4)[1];
        }
      }
      SVar7 = dVar11 + dVar10;
      for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
        SVar7 = SVar7 + pdVar2[lVar6] * pdVar3[lVar6];
      }
    }
    return SVar7;
  }
  __assert_fail("size && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Redux.h"
                ,0xca,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>, 4>>, const Eigen::Matrix<double, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>, 4>>, const Eigen::Matrix<double, -1, 1>>, Traversal = 3, Unrolling = 0]"
               );
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }